

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Psbt::GetTxInKeyDataList
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Psbt *this,uint32_t index)

{
  pointer puVar1;
  pointer __n;
  ulong uVar2;
  long lVar3;
  undefined8 *puVar4;
  ByteData *pBVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdb0;
  ulong local_100;
  size_t arr_index;
  uint32_t *val_arr;
  size_t arr_max;
  undefined1 local_d0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData fingerprint;
  undefined1 local_88 [8];
  Pubkey pubkey;
  ByteData key;
  size_t key_index;
  wally_map_item *item;
  size_t key_max;
  wally_psbt *psbt_pointer;
  uint32_t index_local;
  Psbt *this_local;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *arr;
  
  pBVar5 = (ByteData *)__return_storage_ptr__;
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa67,"GetTxInKeyDataList");
  puVar1 = (((KeyData *)this)->pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = *(pointer *)(*(long *)(puVar1 + 0x10) + 0x50 + (ulong)index * 0x110);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            (__return_storage_ptr__);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
            (__return_storage_ptr__,(size_type)__n);
  for (key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < __n;
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) {
    puVar4 = (undefined8 *)
             (*(long *)(*(long *)(puVar1 + 0x10) + 0x48 + (ulong)index * 0x110) +
             (long)key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage * 0x20);
    ByteData::ByteData((ByteData *)
                       &pubkey.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(uint8_t *)*puVar4,
                       *(uint32_t *)(puVar4 + 1));
    ByteData::ByteData((ByteData *)this,pBVar5);
    Pubkey::Pubkey((Pubkey *)local_88,
                   (ByteData *)
                   &fingerprint.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)0x477de7);
    ByteData::ByteData((ByteData *)
                       &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x477e01);
    if (((puVar4[3] & 3) == 0) && (puVar4[3] != 0)) {
      ByteData::ByteData((ByteData *)&arr_max,(uint8_t *)puVar4[2],4);
      ByteData::operator=((ByteData *)this,pBVar5);
      ByteData::~ByteData((ByteData *)0x477e60);
      uVar2 = puVar4[3];
      lVar3 = puVar4[2];
      for (local_100 = 1; local_100 < uVar2 >> 2; local_100 = local_100 + 1) {
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,
                   (value_type_conflict1 *)(lVar3 + local_100 * 4));
      }
    }
    KeyData::KeyData((KeyData *)&stack0xfffffffffffffdb0,(Pubkey *)local_88,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,
                     (ByteData *)
                     &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
    emplace_back<cfd::core::KeyData>(__return_storage_ptr__,(KeyData *)&stack0xfffffffffffffdb0);
    KeyData::~KeyData((KeyData *)this);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffdb0);
    ByteData::~ByteData((ByteData *)0x477f93);
    Pubkey::~Pubkey((Pubkey *)0x477f9c);
    ByteData::~ByteData((ByteData *)0x477fa5);
  }
  return (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)pBVar5;
}

Assistant:

std::vector<KeyData> Psbt::GetTxInKeyDataList(uint32_t index) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  size_t key_max = psbt_pointer->inputs[index].keypaths.num_items;
  std::vector<KeyData> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->inputs[index].keypaths.items[key_index];
    ByteData key(item->key, static_cast<uint32_t>(item->key_len));
    Pubkey pubkey(key);
    ByteData fingerprint;
    std::vector<uint32_t> path;
    if (((item->value_len % 4) == 0) && (item->value_len > 0)) {
      fingerprint = ByteData(item->value, 4);

      // TODO(k-matsuzawa) Need endian support.
      size_t arr_max = item->value_len / 4;
      uint32_t *val_arr = reinterpret_cast<uint32_t *>(item->value);
      for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
        path.push_back(val_arr[arr_index]);
      }
    }
    arr.emplace_back(KeyData(pubkey, path, fingerprint));
  }
  return arr;
}